

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
* __thiscall
capnp::anon_unknown_1::CapnpcCppMain::TemplateContext::getScopeMap
          (map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
           *__return_storage_ptr__,TemplateContext *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  Reader params;
  key_type local_58;
  Reader local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  do {
    capnp::schema::Node::Reader::getParameters(&local_50,&this->node);
    if (local_50.reader.elementCount != 0) {
      if ((this->node)._reader.dataSize < 0x40) {
        local_58 = 0;
      }
      else {
        local_58 = *(this->node)._reader.data;
      }
      pmVar2 = std::
               map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
               ::operator[](__return_storage_ptr__,&local_58);
      (pmVar2->reader).structDataSize = local_50.reader.structDataSize;
      (pmVar2->reader).structPointerCount = local_50.reader.structPointerCount;
      (pmVar2->reader).elementSize = local_50.reader.elementSize;
      (pmVar2->reader).field_0x27 = local_50.reader._39_1_;
      (pmVar2->reader).nestingLimit = local_50.reader.nestingLimit;
      *(undefined4 *)&(pmVar2->reader).field_0x2c = local_50.reader._44_4_;
      (pmVar2->reader).ptr = local_50.reader.ptr;
      (pmVar2->reader).elementCount = local_50.reader.elementCount;
      (pmVar2->reader).step = local_50.reader.step;
      (pmVar2->reader).segment = local_50.reader.segment;
      (pmVar2->reader).capTable = local_50.reader.capTable;
    }
    this = (this->parent).ptr;
  } while (this != (TemplateContext *)0x0);
  return __return_storage_ptr__;
}

Assistant:

std::map<uint64_t, List<schema::Node::Parameter>::Reader> getScopeMap() const {
      std::map<uint64_t, List<schema::Node::Parameter>::Reader> result;
      const TemplateContext* current = this;
      for (;;) {
        auto params = current->node.getParameters();
        if (params.size() > 0) {
          result[current->node.getId()] = params;
        }
        KJ_IF_MAYBE(p, current->parent) {
          current = p;
        } else {
          return result;
        }
      }
    }